

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O1

_Bool no_vault(wchar_t place)

{
  topography tVar1;
  
  tVar1 = world->levels[place].topography;
  if ((tVar1 != TOP_CAVE) &&
     ((tVar1 == TOP_MOUNTAINTOP || (world->levels[place].down != (char *)0x0)))) {
    return true;
  }
  return false;
}

Assistant:

bool no_vault(int place)
{
	struct level *lev = &world->levels[place];

	/* No vaults on mountaintops */
	if (lev->topography == TOP_MOUNTAINTOP)
		return true;

	/* No vaults on dungeon entrances */
	if ((lev->topography != TOP_CAVE) && (lev->down))
		return true;

	/* Anywhere else is OK */
	return false;
}